

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabel::setPixmap(QLabel *this,QPixmap *pixmap)

{
  optional<QIcon> *poVar1;
  bool bVar2;
  QLabelPrivate *this_00;
  bool bVar3;
  _Storage<QIcon,_false> _Var4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined4 extraout_EDX;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  QIcon moved;
  _Storage<QIcon,_false> local_70;
  QSize local_68 [3];
  QArrayData *local_50;
  long local_48;
  long local_40;
  _Storage<QIcon,_false> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  poVar1 = &this_00->icon;
  bVar2 = (this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
          super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
          _M_engaged;
  if (bVar2 == true) {
    QIcon::availableSizes((Mode)&local_50,(State)poVar1);
    uVar5 = QPixmap::size();
    if (local_40 == 0) {
LAB_004171bd:
      lVar10 = -1;
    }
    else {
      lVar6 = -8;
      do {
        lVar10 = lVar6;
        lVar7 = local_40 * -8 + lVar10;
        if (lVar7 == -8) goto LAB_004171b7;
        lVar6 = lVar10 + 8;
      } while ((*(int *)(local_48 + 8 + lVar10) != (int)uVar5) ||
              (*(int *)(local_48 + 0xc + lVar10) != (int)((ulong)uVar5 >> 0x20)));
      lVar10 = lVar6 >> 3;
LAB_004171b7:
      if (lVar7 == -8) goto LAB_004171bd;
    }
    if (lVar10 == -1) goto LAB_0041721d;
    if ((this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
        super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
        _M_engaged == false) {
      setPixmap();
      goto LAB_0041736d;
    }
    local_38 = (_Storage<QIcon,_false>)QPixmap::size();
    QIcon::pixmap(local_68,(State)poVar1,(State)&local_38);
    lVar6 = QPixmap::cacheKey();
    lVar7 = QPixmap::cacheKey();
    bVar12 = lVar6 == lVar7;
    bVar3 = true;
  }
  else {
LAB_0041721d:
    bVar3 = false;
    bVar12 = false;
  }
  if (bVar3) {
    QPixmap::~QPixmap((QPixmap *)local_68);
  }
  if ((bVar2 != false) && (local_50 != (QArrayData *)0x0)) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,8,0x10);
    }
  }
  if (!bVar12) {
    QLabelPrivate::clearContents(this_00);
    QIcon::QIcon(&local_70._M_value,pixmap);
    _Var4 = local_70;
    if ((this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
        super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
        _M_engaged == true) {
      local_70 = (_Storage<QIcon,_false>)0x0;
      local_38 = (poVar1->super__Optional_base<QIcon,_false,_false>)._M_payload.
                 super__Optional_payload<QIcon,_true,_false,_false>.
                 super__Optional_payload_base<QIcon>._M_payload;
      (poVar1->super__Optional_base<QIcon,_false,_false>)._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_payload = _Var4;
      QIcon::~QIcon(&local_38._M_value);
    }
    else {
      local_70 = (_Storage<QIcon,_false>)0x0;
      (this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_payload = _Var4;
      (this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_engaged = true;
    }
    QIcon::~QIcon(&local_70._M_value);
    dVar13 = (double)QPixmap::deviceIndependentSize();
    auVar15._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar15._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    auVar15 = minpd(_DAT_0066f5d0,auVar15);
    auVar14._8_8_ = -(ulong)(-2147483648.0 < auVar15._8_8_);
    auVar14._0_8_ = -(ulong)(-2147483648.0 < auVar15._0_8_);
    uVar9 = movmskpd(extraout_EDX,auVar14);
    uVar11 = 0x8000000000000000;
    if ((uVar9 & 1) != 0) {
      uVar11 = (ulong)(uint)(int)auVar15._0_8_ << 0x20;
    }
    uVar8 = 0x80000000;
    if ((uVar9 & 2) != 0) {
      uVar8 = (ulong)(uint)(int)auVar15._8_8_;
    }
    this_00->pixmapSize = (QSize)(uVar8 | uVar11);
    QLabelPrivate::updateLabel(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0041736d:
  __stack_chk_fail();
}

Assistant:

void QLabel::setPixmap(const QPixmap &pixmap)
{
    Q_D(QLabel);
    if (d->icon && d->icon->availableSizes().contains(pixmap.size()) &&
        d->icon->pixmap(pixmap.size()).cacheKey() == pixmap.cacheKey())
        return;
    d->clearContents();
    d->icon = QIcon(pixmap);
    d->pixmapSize = pixmap.deviceIndependentSize().toSize();
    d->updateLabel();
}